

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O1

void show_fail(TestReporter *reporter,char *file,int line,char *message,__va_list_tag *arguments)

{
  undefined8 *memo;
  
  memo = (undefined8 *)reporter->memo;
  if ((reporter->options != (void *)0x0) && (*(char *)((long)reporter->options + 1) == '\x01')) {
    (*(code *)*memo)("\n");
  }
  (*(code *)*memo)("%s:%d: ",file,line);
  (*(code *)*memo)("Failure: ");
  *(undefined4 *)(memo + 2) = 0;
  walk_breadcrumb(reporter->breadcrumb,show_breadcrumb,memo);
  (*(code *)*memo)("\n\t");
  if (message == (char *)0x0) {
    (*(code *)*memo)("<FATAL: NULL for failure message>");
  }
  else {
    (*(code *)memo[1])(message,arguments);
  }
  (*(code *)*memo)("\n");
  (*(code *)*memo)();
  fflush((FILE *)0x0);
  return;
}

Assistant:

static void show_fail(TestReporter *reporter, const char *file, int line,
                      const char *message, va_list arguments) {
    TextMemo *memo = (TextMemo *)reporter->memo;
    if (have_quiet_mode(reporter)) memo->printer("\n");
    memo->printer("%s:%d: ", file, line);
    memo->printer("Failure: ");
    memo->depth = 0;
    walk_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb, &show_breadcrumb, memo);
    memo->printer("\n\t");
    // Simplify *printf statements for more robust cross-platform logging
    if (message == NULL) {
        memo->printer("<FATAL: NULL for failure message>");
    } else {
        memo->vprinter(message, arguments);
    }
    memo->printer("\n");
    memo->printer("\n");
    fflush(NULL);
}